

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

xmlRefPtr xmlAddRef(xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlChar *value,xmlAttrPtr attr)

{
  int iVar1;
  xmlRefPtr data;
  xmlChar *pxVar2;
  long lVar3;
  xmlListPtr local_48;
  xmlListPtr ref_list;
  xmlRefTablePtr table;
  xmlRefPtr ret;
  xmlAttrPtr attr_local;
  xmlChar *value_local;
  xmlDocPtr doc_local;
  xmlValidCtxtPtr ctxt_local;
  
  if (doc == (xmlDocPtr)0x0) {
    return (xmlRefPtr)0x0;
  }
  if (value == (xmlChar *)0x0) {
    return (xmlRefPtr)0x0;
  }
  if (attr == (xmlAttrPtr)0x0) {
    return (xmlRefPtr)0x0;
  }
  ref_list = (xmlListPtr)doc->refs;
  if (ref_list == (xmlListPtr)0x0) {
    ref_list = (xmlListPtr)xmlHashCreateDict(0,doc->dict);
    doc->refs = ref_list;
  }
  if (ref_list == (xmlListPtr)0x0) {
    xmlVErrMemory(ctxt,"xmlAddRef: Table creation failed!\n");
    return (xmlRefPtr)0x0;
  }
  data = (xmlRefPtr)(*xmlMalloc)(0x28);
  if (data == (xmlRefPtr)0x0) {
    xmlVErrMemory(ctxt,"malloc failed");
    return (xmlRefPtr)0x0;
  }
  pxVar2 = xmlStrdup(value);
  data->value = pxVar2;
  iVar1 = xmlIsStreaming(ctxt);
  if (iVar1 == 0) {
    data->name = (xmlChar *)0x0;
    data->attr = attr;
  }
  else {
    pxVar2 = xmlStrdup(attr->name);
    data->name = pxVar2;
    data->attr = (xmlAttrPtr)0x0;
  }
  lVar3 = xmlGetLineNo(attr->parent);
  data->lineno = (int)lVar3;
  local_48 = (xmlListPtr)xmlHashLookup((xmlHashTablePtr)ref_list,value);
  if (local_48 == (xmlListPtr)0x0) {
    local_48 = xmlListCreate(xmlFreeRef,xmlDummyCompare);
    if (local_48 == (xmlListPtr)0x0) {
      xmlErrValid((xmlValidCtxtPtr)0x0,XML_ERR_INTERNAL_ERROR,
                  "xmlAddRef: Reference list creation failed!\n",(char *)0x0);
      goto LAB_001d2855;
    }
    iVar1 = xmlHashAddEntry((xmlHashTablePtr)ref_list,value,local_48);
    if (iVar1 < 0) {
      xmlListDelete(local_48);
      xmlErrValid((xmlValidCtxtPtr)0x0,XML_ERR_INTERNAL_ERROR,
                  "xmlAddRef: Reference list insertion failed!\n",(char *)0x0);
      goto LAB_001d2855;
    }
  }
  iVar1 = xmlListAppend(local_48,data);
  if (iVar1 == 0) {
    return data;
  }
  xmlErrValid((xmlValidCtxtPtr)0x0,XML_ERR_INTERNAL_ERROR,
              "xmlAddRef: Reference list insertion failed!\n",(char *)0x0);
LAB_001d2855:
  if (data != (xmlRefPtr)0x0) {
    if (data->value != (xmlChar *)0x0) {
      (*xmlFree)(data->value);
    }
    if (data->name != (xmlChar *)0x0) {
      (*xmlFree)(data->name);
    }
    (*xmlFree)(data);
  }
  return (xmlRefPtr)0x0;
}

Assistant:

xmlRefPtr
xmlAddRef(xmlValidCtxtPtr ctxt, xmlDocPtr doc, const xmlChar *value,
    xmlAttrPtr attr) {
    xmlRefPtr ret;
    xmlRefTablePtr table;
    xmlListPtr ref_list;

    if (doc == NULL) {
        return(NULL);
    }
    if (value == NULL) {
        return(NULL);
    }
    if (attr == NULL) {
        return(NULL);
    }

    /*
     * Create the Ref table if needed.
     */
    table = (xmlRefTablePtr) doc->refs;
    if (table == NULL) {
        doc->refs = table = xmlHashCreateDict(0, doc->dict);
    }
    if (table == NULL) {
	xmlVErrMemory(ctxt,
            "xmlAddRef: Table creation failed!\n");
        return(NULL);
    }

    ret = (xmlRefPtr) xmlMalloc(sizeof(xmlRef));
    if (ret == NULL) {
	xmlVErrMemory(ctxt, "malloc failed");
        return(NULL);
    }

    /*
     * fill the structure.
     */
    ret->value = xmlStrdup(value);
    if (xmlIsStreaming(ctxt)) {
	/*
	 * Operating in streaming mode, attr is gonna disappear
	 */
	ret->name = xmlStrdup(attr->name);
	ret->attr = NULL;
    } else {
	ret->name = NULL;
	ret->attr = attr;
    }
    ret->lineno = xmlGetLineNo(attr->parent);

    /* To add a reference :-
     * References are maintained as a list of references,
     * Lookup the entry, if no entry create new nodelist
     * Add the owning node to the NodeList
     * Return the ref
     */

    if (NULL == (ref_list = xmlHashLookup(table, value))) {
        if (NULL == (ref_list = xmlListCreate(xmlFreeRef, xmlDummyCompare))) {
	    xmlErrValid(NULL, XML_ERR_INTERNAL_ERROR,
		    "xmlAddRef: Reference list creation failed!\n",
		    NULL);
	    goto failed;
        }
        if (xmlHashAddEntry(table, value, ref_list) < 0) {
            xmlListDelete(ref_list);
	    xmlErrValid(NULL, XML_ERR_INTERNAL_ERROR,
		    "xmlAddRef: Reference list insertion failed!\n",
		    NULL);
	    goto failed;
        }
    }
    if (xmlListAppend(ref_list, ret) != 0) {
	xmlErrValid(NULL, XML_ERR_INTERNAL_ERROR,
		    "xmlAddRef: Reference list insertion failed!\n",
		    NULL);
        goto failed;
    }
    return(ret);
failed:
    if (ret != NULL) {
        if (ret->value != NULL)
	    xmlFree((char *)ret->value);
        if (ret->name != NULL)
	    xmlFree((char *)ret->name);
        xmlFree(ret);
    }
    return(NULL);
}